

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_ApproximateSize::_Run(_Test_ApproximateSize *this)

{
  size_t one_key_size;
  size_t two_keys_size;
  WriteBatch batch;
  size_t post_delete_size;
  size_t empty_size;
  size_t local_1f8;
  Slice local_1f0;
  WriteBatch local_1e0;
  size_t local_1c0;
  size_t local_1b8;
  Tester local_1b0;
  
  WriteBatch::WriteBatch(&local_1e0);
  local_1b8 = WriteBatch::ApproximateSize(&local_1e0);
  local_1b0._0_8_ = "foo";
  local_1b0.fname_ = (char *)0x3;
  local_1f0.data_ = "bar";
  local_1f0.size_ = 3;
  WriteBatch::Put(&local_1e0,(Slice *)&local_1b0,&local_1f0);
  local_1f8 = WriteBatch::ApproximateSize(&local_1e0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x7c;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b0 + 0x18));
  test::Tester::IsLt<unsigned_long,unsigned_long>(&local_1b0,&local_1b8,&local_1f8);
  test::Tester::~Tester(&local_1b0);
  local_1b0._0_8_ = "baz";
  local_1b0.fname_ = (char *)0x3;
  local_1f0.data_ = "boo";
  local_1f0.size_ = 3;
  WriteBatch::Put(&local_1e0,(Slice *)&local_1b0,&local_1f0);
  local_1f0.data_ = (char *)WriteBatch::ApproximateSize(&local_1e0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x80;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b0 + 0x18));
  test::Tester::IsLt<unsigned_long,unsigned_long>(&local_1b0,&local_1f8,(unsigned_long *)&local_1f0)
  ;
  test::Tester::~Tester(&local_1b0);
  local_1b0._0_8_ = "box";
  local_1b0.fname_ = (char *)0x3;
  WriteBatch::Delete(&local_1e0,(Slice *)&local_1b0);
  local_1c0 = WriteBatch::ApproximateSize(&local_1e0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x84;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b0 + 0x18));
  test::Tester::IsLt<unsigned_long,unsigned_long>(&local_1b0,(unsigned_long *)&local_1f0,&local_1c0)
  ;
  test::Tester::~Tester(&local_1b0);
  WriteBatch::~WriteBatch(&local_1e0);
  return;
}

Assistant:

TEST(WriteBatchTest, ApproximateSize) {
  WriteBatch batch;
  size_t empty_size = batch.ApproximateSize();

  batch.Put(Slice("foo"), Slice("bar"));
  size_t one_key_size = batch.ApproximateSize();
  ASSERT_LT(empty_size, one_key_size);

  batch.Put(Slice("baz"), Slice("boo"));
  size_t two_keys_size = batch.ApproximateSize();
  ASSERT_LT(one_key_size, two_keys_size);

  batch.Delete(Slice("box"));
  size_t post_delete_size = batch.ApproximateSize();
  ASSERT_LT(two_keys_size, post_delete_size);
}